

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O2

bool SparseKeyTest<16,Blob<128>>
               (hashfunc<Blob<128>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  int iVar3;
  Blob<16> local_4a;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> hashes;
  
  pcVar2 = "exactly";
  iVar3 = (int)CONCAT71(in_register_00000011,inclusive);
  if (iVar3 != 0) {
    pcVar2 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x10,pcVar2,(ulong)(uint)setbits);
  hashes.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_4a.bytes[0] = '\0';
  local_4a.bytes[1] = '\0';
  hashes.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  hashes.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (iVar3 != 0) {
    std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::resize(&hashes,1);
    (*hash.m_hash)(&local_4a,2,0,
                   hashes.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.
                   super__Vector_impl_data._M_start);
  }
  SparseKeygenRecurse<Blob<16>,Blob<128>>(hash.m_hash,0,setbits,inclusive,&local_4a,&hashes);
  printf("%d keys\n",
         (ulong)((long)hashes.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)hashes.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.
                      super__Vector_impl_data._M_start) >> 4);
  bVar1 = TestHashList<Blob<128>>(&hashes,drawDiagram,testColl,testDist,true,true);
  putchar(10);
  std::_Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>::~_Vector_base
            (&hashes.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>);
  return bVar1;
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive,
                     bool testColl, bool testDist, bool drawDiagram )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits,
         inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashes.resize(1);
    hash(&k,sizeof(keytype),0,&hashes[0]);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}